

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress4X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  uint uVar1;
  ulong srcSize_00;
  void *pvVar2;
  void *pvVar3;
  size_t cSize_3;
  size_t cSize_2;
  size_t cSize_1;
  size_t cSize;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  size_t segmentSize;
  int bmi2_local;
  HUF_CElt *CTable_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstSize_local;
  void *dst_local;
  
  srcSize_00 = srcSize + 3 >> 2;
  if (dstSize < 0x11) {
    dst_local = (void *)0x0;
  }
  else if (srcSize < 0xc) {
    dst_local = (void *)0x0;
  }
  else {
    pvVar2 = (void *)((long)dst + 6);
    dst_local = (void *)HUF_compress1X_usingCTable_internal
                                  (pvVar2,(long)dst + (dstSize - (long)pvVar2),src,srcSize_00,CTable
                                   ,bmi2);
    uVar1 = ERR_isError((size_t)dst_local);
    if (uVar1 == 0) {
      if (dst_local == (void *)0x0) {
        dst_local = (void *)0x0;
      }
      else {
        MEM_writeLE16(dst,(U16)dst_local);
        pvVar2 = (void *)((long)dst_local + (long)pvVar2);
        dst_local = (void *)HUF_compress1X_usingCTable_internal
                                      (pvVar2,(long)dst + (dstSize - (long)pvVar2),
                                       (void *)(srcSize_00 + (long)src),srcSize_00,CTable,bmi2);
        uVar1 = ERR_isError((size_t)dst_local);
        if (uVar1 == 0) {
          if (dst_local == (void *)0x0) {
            dst_local = (void *)0x0;
          }
          else {
            MEM_writeLE16((void *)((long)dst + 2),(U16)dst_local);
            pvVar2 = (void *)((long)dst_local + (long)pvVar2);
            pvVar3 = (void *)(srcSize_00 + (long)(srcSize_00 + (long)src));
            dst_local = (void *)HUF_compress1X_usingCTable_internal
                                          (pvVar2,(long)dst + (dstSize - (long)pvVar2),pvVar3,
                                           srcSize_00,CTable,bmi2);
            uVar1 = ERR_isError((size_t)dst_local);
            if (uVar1 == 0) {
              if (dst_local == (void *)0x0) {
                dst_local = (void *)0x0;
              }
              else {
                MEM_writeLE16((void *)((long)dst + 4),(U16)dst_local);
                pvVar2 = (void *)((long)dst_local + (long)pvVar2);
                pvVar3 = (void *)(srcSize_00 + (long)pvVar3);
                dst_local = (void *)HUF_compress1X_usingCTable_internal
                                              (pvVar2,(long)dst + (dstSize - (long)pvVar2),pvVar3,
                                               (long)src + (srcSize - (long)pvVar3),CTable,bmi2);
                uVar1 = ERR_isError((size_t)dst_local);
                if (uVar1 == 0) {
                  if (dst_local == (void *)0x0) {
                    dst_local = (void *)0x0;
                  }
                  else {
                    dst_local = (void *)(((long)dst_local + (long)pvVar2) - (long)dst);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)dst_local;
}

Assistant:

static size_t
HUF_compress4X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, int bmi2)
{
    size_t const segmentSize = (srcSize+3)/4;   /* first 3 segments */
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    BYTE* const ostart = (BYTE*) dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    if (dstSize < 6 + 1 + 1 + 1 + 8) return 0;   /* minimum space to compress successfully */
    if (srcSize < 12) return 0;   /* no saving possible : too small input */
    op += 6;   /* jumpTable */

    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, bmi2) );
        if (cSize==0) return 0;
        assert(cSize <= 65535);
        MEM_writeLE16(ostart, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, bmi2) );
        if (cSize==0) return 0;
        assert(cSize <= 65535);
        MEM_writeLE16(ostart+2, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, bmi2) );
        if (cSize==0) return 0;
        assert(cSize <= 65535);
        MEM_writeLE16(ostart+4, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    assert(ip <= iend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, (size_t)(iend-ip), CTable, bmi2) );
        if (cSize==0) return 0;
        op += cSize;
    }

    return (size_t)(op-ostart);
}